

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O0

void __thiscall
Iir::BandStopTransform::BandStopTransform
          (BandStopTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t c_02;
  bool bVar1;
  uint uVar2;
  PoleZeroPair *pPVar3;
  LayoutBase *in_RDX;
  LayoutBase *in_RSI;
  complex<double> *in_RDI;
  double in_XMM0_Qa;
  BandStopTransform *this_00;
  complex<double> *__y;
  double dVar4;
  double in_XMM1_Qa;
  ComplexPair zeros;
  ComplexPair poles;
  ComplexPair z;
  ComplexPair p;
  PoleZeroPair *pair;
  int i;
  int pairs;
  int numPoles;
  double ww;
  undefined8 in_stack_fffffffffffffec8;
  int pairIndex;
  LayoutBase *in_stack_fffffffffffffed0;
  ComplexPair *in_stack_ffffffffffffff10;
  ComplexPair *poles_00;
  LayoutBase *this_01;
  complex_t *zero;
  complex_t *in_stack_ffffffffffffff68;
  LayoutBase *in_stack_ffffffffffffff70;
  int local_3c;
  
  in_RDI->_M_value[0] = '\0';
  in_RDI->_M_value[1] = '\0';
  in_RDI->_M_value[2] = '\0';
  in_RDI->_M_value[3] = '\0';
  in_RDI->_M_value[4] = '\0';
  in_RDI->_M_value[5] = '\0';
  in_RDI->_M_value[6] = '\0';
  in_RDI->_M_value[7] = '\0';
  in_RDI->_M_value[8] = '\0';
  in_RDI->_M_value[9] = '\0';
  in_RDI->_M_value[10] = '\0';
  in_RDI->_M_value[0xb] = '\0';
  in_RDI->_M_value[0xc] = '\0';
  in_RDI->_M_value[0xd] = '\0';
  in_RDI->_M_value[0xe] = '\0';
  in_RDI->_M_value[0xf] = '\0';
  in_RDI[1]._M_value[0] = '\0';
  in_RDI[1]._M_value[1] = '\0';
  in_RDI[1]._M_value[2] = '\0';
  in_RDI[1]._M_value[3] = '\0';
  in_RDI[1]._M_value[4] = '\0';
  in_RDI[1]._M_value[5] = '\0';
  in_RDI[1]._M_value[6] = '\0';
  in_RDI[1]._M_value[7] = '\0';
  in_RDI[1]._M_value[8] = '\0';
  in_RDI[1]._M_value[9] = '\0';
  in_RDI[1]._M_value[10] = '\0';
  in_RDI[1]._M_value[0xb] = '\0';
  in_RDI[1]._M_value[0xc] = '\0';
  in_RDI[1]._M_value[0xd] = '\0';
  in_RDI[1]._M_value[0xe] = '\0';
  in_RDI[1]._M_value[0xf] = '\0';
  in_RDI[2]._M_value[0] = '\0';
  in_RDI[2]._M_value[1] = '\0';
  in_RDI[2]._M_value[2] = '\0';
  in_RDI[2]._M_value[3] = '\0';
  in_RDI[2]._M_value[4] = '\0';
  in_RDI[2]._M_value[5] = '\0';
  in_RDI[2]._M_value[6] = '\0';
  in_RDI[2]._M_value[7] = '\0';
  in_RDI[2]._M_value[8] = '\0';
  in_RDI[2]._M_value[9] = '\0';
  in_RDI[2]._M_value[10] = '\0';
  in_RDI[2]._M_value[0xb] = '\0';
  in_RDI[2]._M_value[0xc] = '\0';
  in_RDI[2]._M_value[0xd] = '\0';
  in_RDI[2]._M_value[0xe] = '\0';
  in_RDI[2]._M_value[0xf] = '\0';
  if (0.5 <= in_XMM0_Qa) {
    throw_invalid_argument((char *)in_RDI);
  }
  if (in_XMM0_Qa < 0.0) {
    throw_invalid_argument((char *)in_RDI);
  }
  LayoutBase::reset(in_RSI);
  this_00 = (BandStopTransform *)(in_XMM1_Qa * 6.283185307179586);
  *(double *)(in_RDI->_M_value + 8) = in_XMM0_Qa * 6.283185307179586 + -((double)this_00 / 2.0);
  *(double *)in_RDI->_M_value = *(double *)(in_RDI->_M_value + 8) + (double)this_00;
  if (*(double *)(in_RDI->_M_value + 8) <= 1e-08 && *(double *)(in_RDI->_M_value + 8) != 1e-08) {
    in_RDI->_M_value[8] = ':';
    in_RDI->_M_value[9] = -0x74;
    in_RDI->_M_value[10] = '0';
    in_RDI->_M_value[0xb] = -0x1e;
    in_RDI->_M_value[0xc] = -0x72;
    in_RDI->_M_value[0xd] = 'y';
    in_RDI->_M_value[0xe] = 'E';
    in_RDI->_M_value[0xf] = '>';
  }
  if (3.141592643589793 < *(double *)in_RDI->_M_value) {
    in_RDI->_M_value[0] = '*';
    in_RDI->_M_value[1] = -0x6c;
    in_RDI->_M_value[2] = -0x14;
    in_RDI->_M_value[3] = 'R';
    in_RDI->_M_value[4] = -5;
    in_RDI->_M_value[5] = '!';
    in_RDI->_M_value[6] = '\t';
    in_RDI->_M_value[7] = '@';
  }
  __y = (complex<double> *)
        cos((*(double *)in_RDI->_M_value + *(double *)(in_RDI->_M_value + 8)) * 0.5);
  dVar4 = cos((*(double *)in_RDI->_M_value - *(double *)(in_RDI->_M_value + 8)) * 0.5);
  *(double *)in_RDI[1]._M_value = (double)__y / dVar4;
  dVar4 = tan((*(double *)in_RDI->_M_value - *(double *)(in_RDI->_M_value + 8)) * 0.5);
  *(double *)(in_RDI[1]._M_value + 8) = dVar4;
  *(double *)in_RDI[2]._M_value = *(double *)in_RDI[1]._M_value * *(double *)in_RDI[1]._M_value;
  *(double *)(in_RDI[2]._M_value + 8) =
       *(double *)(in_RDI[1]._M_value + 8) * *(double *)(in_RDI[1]._M_value + 8);
  uVar2 = LayoutBase::getNumPoles(in_RDX);
  for (local_3c = 0; pairIndex = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
      local_3c < (int)uVar2 / 2; local_3c = local_3c + 1) {
    pPVar3 = LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    c._M_value._8_8_ = in_RSI;
    c._M_value._0_8_ = in_RDX;
    transform(this_00,c);
    zero = *(complex_t **)((pPVar3->zeros).super_complex_pair_t.first._M_value + 8);
    c_00._M_value._8_8_ = in_RSI;
    c_00._M_value._0_8_ = in_RDX;
    transform(this_00,c_00);
    bVar1 = std::operator==(in_RDI,__y);
    if (bVar1) {
      std::conj<double>((complex<double> *)in_stack_fffffffffffffed0);
    }
    LayoutBase::addPoleZeroConjugatePairs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,zero);
    LayoutBase::addPoleZeroConjugatePairs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,zero);
  }
  if ((uVar2 & 1) != 0) {
    pPVar3 = LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    poles_00 = *(ComplexPair **)(pPVar3->poles).super_complex_pair_t.first._M_value;
    this_01 = *(LayoutBase **)((pPVar3->poles).super_complex_pair_t.first._M_value + 8);
    c_01._M_value._8_8_ = in_RSI;
    c_01._M_value._0_8_ = in_RDX;
    transform(this_00,c_01);
    LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    c_02._M_value._8_8_ = in_RSI;
    c_02._M_value._0_8_ = in_RDX;
    transform(this_00,c_02);
    LayoutBase::add(this_01,poles_00,in_stack_ffffffffffffff10);
  }
  if (0.25 <= in_XMM0_Qa) {
    dVar4 = LayoutBase::getNormalGain(in_RDX);
    LayoutBase::setNormal(in_RSI,0.0,dVar4);
  }
  else {
    dVar4 = LayoutBase::getNormalGain(in_RDX);
    LayoutBase::setNormal(in_RSI,3.141592653589793,dVar4);
  }
  return;
}

Assistant:

BandStopTransform::BandStopTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// this is crap
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a = cos ((wc + wc2) * .5) /
		cos ((wc - wc2) * .5);
	b = tan ((wc - wc2) * .5);
	a2 = a * a;
	b2 = b * b;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p  = transform (pair.poles.first);
		ComplexPair z  = transform (pair.zeros.first);
		
		// trick to get the conjugate
		if (z.second == z.first)
			z.second = std::conj (z.first);
		
		digital.addPoleZeroConjugatePairs (p.first, z.first);
		digital.addPoleZeroConjugatePairs (p.second, z.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	if (fc < 0.25)
		digital.setNormal (doublePi, analog.getNormalGain());
	else
		digital.setNormal (0, analog.getNormalGain());
}